

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_DCtx_setMaxWindowSize(ZSTD_DCtx *dctx,size_t maxWindowSize)

{
  size_t sVar1;
  
  sVar1 = 0xffffffffffffffc4;
  if ((dctx->streamStage == zdss_init) &&
     (sVar1 = 0xffffffffffffffd6, 0xffffffff800003fe < maxWindowSize - 0x80000001)) {
    dctx->maxWindowSize = maxWindowSize;
    return 0;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_DCtx_setMaxWindowSize(ZSTD_DCtx* dctx, size_t maxWindowSize)
{
    ZSTD_bounds const bounds = ZSTD_dParam_getBounds(ZSTD_d_windowLogMax);
    size_t const min = (size_t)1 << bounds.lowerBound;
    size_t const max = (size_t)1 << bounds.upperBound;
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong);
    RETURN_ERROR_IF(maxWindowSize < min, parameter_outOfBound);
    RETURN_ERROR_IF(maxWindowSize > max, parameter_outOfBound);
    dctx->maxWindowSize = maxWindowSize;
    return 0;
}